

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanLiteralContent(QXmlStreamReaderPrivate *this)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  QChar ch;
  long lVar7;
  long lVar8;
  
  lVar5 = 0;
LAB_003a65aa:
  lVar2 = (this->putStack).tos;
  if (lVar2 == -1) {
    lVar2 = this->readBufferPos;
    if (lVar2 < (this->readBuffer).d.size) {
      this->readBufferPos = lVar2 + 1;
      uVar6 = (uint)(ushort)(this->readBuffer).d.ptr[lVar2];
    }
    else {
      uVar6 = getChar_helper(this);
    }
  }
  else {
    uVar6 = 0xffffffff;
    if (this->atEnd == false) {
      uVar6 = (this->putStack).data[lVar2];
      (this->putStack).tos = lVar2 + -1;
    }
  }
  if (uVar6 == 0xffffffff) {
    return lVar5;
  }
  uVar1 = uVar6 & 0xffff;
  if (uVar1 < 0xd) {
    if (uVar1 != 9) {
      if (uVar1 != 10) {
        if (uVar1 != 0) goto LAB_003a6638;
LAB_003a6742:
        lVar2 = (this->putStack).tos;
        lVar7 = (this->putStack).cap;
LAB_003a6754:
        if (lVar7 <= lVar2 + 1) {
          lVar2 = lVar2 + 2;
          lVar8 = lVar7 * 2;
          if (lVar2 != lVar8 && SBORROW8(lVar2,lVar8) == lVar2 + lVar7 * -2 < 0) {
            lVar8 = lVar2;
          }
          (this->putStack).cap = lVar8;
          puVar3 = (uint *)realloc((this->putStack).data,lVar8 << 2);
          (this->putStack).data = puVar3;
          if (puVar3 == (uint *)0x0) {
            qBadAlloc();
          }
        }
        lVar2 = (this->putStack).tos;
        (this->putStack).tos = lVar2 + 1;
        (this->putStack).data[lVar2 + 1] = uVar6;
        return lVar5;
      }
LAB_003a6700:
      this->lineNumber = this->lineNumber + 1;
      this->lastLineStart = this->readBufferPos + this->characterOffset;
    }
LAB_003a671c:
    if ((this->field_0x3a8 & 0x20) == 0) goto LAB_003a6726;
    ch.ucs = L' ';
  }
  else {
    if (uVar1 < 0x3d) {
      uVar4 = (ulong)uVar1;
      if ((0x100000c400000000U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 0xd) {
          if (uVar4 == 0x20) goto LAB_003a671c;
          goto LAB_003a6671;
        }
        lVar2 = (this->putStack).tos;
        if (lVar2 == -1) {
          if (this->readBufferPos < (this->readBuffer).d.size) {
            uVar1 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
          }
          else {
            uVar1 = getChar_helper(this);
            if (uVar1 == 0xffffffff) {
              uVar1 = 0xffffffff;
            }
            else {
              this->readBufferPos = this->readBufferPos + -1;
            }
          }
        }
        else {
          uVar1 = (this->putStack).data[lVar2];
        }
        if (uVar1 != 10) {
          if (uVar1 != 0xffffffff) goto LAB_003a6700;
          lVar2 = (this->putStack).tos;
          lVar7 = (this->putStack).cap;
          uVar6 = 0xd;
          goto LAB_003a6754;
        }
        lVar2 = (this->putStack).tos;
        if (lVar2 == -1) {
          this->readBufferPos = this->readBufferPos + 1;
        }
        else {
          (this->putStack).tos = lVar2 + -1;
        }
        goto LAB_003a6700;
      }
      if ((uVar6 & 0xff0000) == 0) goto LAB_003a6742;
    }
    else {
LAB_003a6671:
      if (uVar1 - 0xfffe < 2) goto LAB_003a6742;
    }
LAB_003a6638:
    if (uVar6 < 0x20) goto LAB_003a6742;
LAB_003a6726:
    ch.ucs = (char16_t)uVar6;
  }
  QString::append(&this->textBuffer,ch);
  lVar5 = lVar5 + 1;
  goto LAB_003a65aa;
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanLiteralContent()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (ushort(c)) {
        case 0xfffe:
        case 0xffff:
        case 0:
            /* The putChar() call is necessary so the parser re-gets
             * the character from the input source, when raising an error. */
            putChar(c);
            return n;
        case '\r':
            if (filterCarriageReturn() == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            if (normalizeLiterals)
                textBuffer += u' ';
            else
                textBuffer += QChar(c);
            ++n;
            break;
        case '&':
        case '<':
        case '\"':
        case '\'':
            if (!(c & 0xff0000)) {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            if (c < 0x20) {
                putChar(c);
                return n;
            }
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }
    return n;
}